

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleCipher.cpp
# Opt level: O3

void __thiscall
security::SimpleCipher::Cipher(SimpleCipher *this,uint8_t *data,uint bytes,uint64_t sequence)

{
  uint32_t uVar1;
  int iVar2;
  int i;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  uint32_t k [4];
  undefined1 local_18 [16];
  
  if (this->ExpandedKey[1] != 0 || this->ExpandedKey[0] != 0) {
    auVar10 = vpbroadcastd_avx512vl();
    auVar10 = vpmuludq_avx2(auVar10,_DAT_001af580);
    auVar11 = vpsrlq_avx2(auVar10,0x13);
    auVar8 = vpbroadcastd_avx512vl();
    auVar9 = vpmovqd_avx512vl(auVar11 ^ auVar10);
    local_18 = vpaddd_avx(auVar8,auVar9);
    k._0_8_ = *(undefined8 *)this->ExpandedKey;
    k._8_8_ = *(undefined8 *)(this->ExpandedKey + 2);
    if (0xf < bytes) {
      do {
        lVar4 = 0;
        do {
          uVar1 = k[lVar4];
          iVar2 = *(int *)(local_18 + lVar4 * 4);
          k[lVar4] = uVar1 + iVar2;
          *(uint *)((long)data + lVar4 * 4) = *(uint *)((long)data + lVar4 * 4) ^ uVar1 + iVar2;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        data = (uint8_t *)((long)data + 0x10);
        bytes = bytes - 0x10;
      } while (0xf < bytes);
    }
    if (bytes < 4) {
      uVar3 = 0;
    }
    else {
      lVar4 = 0;
      uVar3 = (bytes - 4 >> 2) + 1;
      uVar6 = uVar3;
      do {
        uVar7 = *(int *)((long)k + lVar4) + *(int *)(local_18 + lVar4);
        *(uint *)((long)k + lVar4) = uVar7;
        *(uint *)((long)data + lVar4) = *(uint *)((long)data + lVar4) ^ uVar7;
        lVar4 = lVar4 + 4;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
      uVar3 = uVar3 & 3;
      data = (uint8_t *)((long)data + lVar4);
      bytes = bytes - (int)lVar4;
    }
    if (bytes != 0) {
      uVar5 = (ulong)(uVar3 << 2);
      uVar3 = *(int *)((long)k + uVar5) + *(int *)(local_18 + uVar5);
      *(uint *)((long)k + uVar5) = uVar3;
      if (bytes == 1) {
        uVar3 = (uint)(byte)((byte)uVar3 ^ (byte)*(uint3 *)data);
      }
      else {
        if (bytes == 2) {
          uVar3 = uVar3 ^ (ushort)*(uint3 *)data;
        }
        else {
          uVar3 = uVar3 ^ *(uint3 *)data;
          *(byte *)((long)data + 2) = (byte)(uVar3 >> 0x10);
        }
        *(byte *)((long)data + 1) = (byte)(uVar3 >> 8);
      }
      *data = (byte)uVar3;
    }
  }
  return;
}

Assistant:

void SimpleCipher::Cipher(uint8_t* data, unsigned bytes, uint64_t sequence)
{
#ifndef SECURITY_ENABLE_ENCRYPTION
    SECURITY_UNUSED(data); SECURITY_UNUSED(bytes); SECURITY_UNUSED(nonce);
#else // SECURITY_ENABLE_ENCRYPTION
    // Skip encryption if the key is zero
    if (ExpandedKey[0] == 0 && ExpandedKey[1] == 0) {
        return;
    }

    /*
        Encryption and decryption are the same:

        (1) Mix session key and nonce into 16 byte datagram key
        (2) XOR 16 bytes of data at a time by the datagram key

        This admits a lot of attacks of course:  Plaintext data that is zeros
        will reveal the XOR key for the rest of that datagram.  Two 16-byte
        blocks can be XOR'd together to get the XOR of two plaintext pieces.
        Each key leak will eventually lead to session key recovery fairly fast.

        It's not secure. But it is very fast, hides the packet contents, and
        will slow down reverse-engineers who always win eventually.
    */

    static const uint32_t p0 = 0x905c4577;
    static const uint32_t p1 = 0xb84c88cb;
    static const uint32_t p2 = 0xde0efbf1;
    static const uint32_t p3 = 0x9f614c3d;
    static const uint32_t p4 = 0xf3f77d13;
    static const uint32_t x0 = 0x80771ab1;
    static const uint32_t x1 = 0x55f2cc88;

    const uint32_t n0 = (uint32_t)sequence + x0;
    const uint32_t n1 = MultiplyAndFold19((uint32_t)(sequence >> 32) + x1, p4);

    // Mix session key and nonce
    const uint32_t a[4] = {
        MultiplyAndFold19(p0, n0) + n1,
        MultiplyAndFold19(p1, n0) + n1,
        MultiplyAndFold19(p2, n0) + n1,
        MultiplyAndFold19(p3, n0) + n1
    };

    uint32_t k[4];
    for (int i = 0; i < 4; ++i) {
        k[i] = ExpandedKey[i];
    }

    // Handle sets of 16 bytes
#ifdef ENABLE_SIMD_ENCRYPTION
    if (bytes >= 16)
    {
        SECURITY_M128 key = _mm_set_epi32(k[3], k[2], k[1], k[0]);
        const SECURITY_M128 add = _mm_set_epi32(a[3], a[2], a[1], a[0]);

        while (bytes >= 16)
        {
            key = _mm_add_epi32(key, add);

            SECURITY_M128* data16 = reinterpret_cast<SECURITY_M128*>(data);
            _mm_storeu_si128(data16, _mm_xor_si128(_mm_loadu_si128(data16), key));

            data += 16, bytes -= 16;
        }

        union {
            SECURITY_M128 v;
            uint32_t a[4];
        } e;
        e.v = key;
        for (int i = 0; i < 4; ++i) {
            k[i] = e.a[i];
        }
    }
#else
    while (bytes >= 16)
    {
        for (int i = 0; i < 4; ++i)
        {
            k[i] += a[i];
            const uint32_t x = ReadU32_LE(data + i * 4) ^ k[i];
            WriteU32_LE(data + i * 4, x);
        }

        data += 16, bytes -= 16;
    }
#endif

    // XOR remaining bytes
    unsigned i = 0;
    while (bytes >= 4)
    {
        k[i & 3] += a[i & 3];

        WriteU32_LE(data, ReadU32_LE(data) ^ k[i & 3]);
        data += 4, bytes -= 4, ++i;
    }

    if (bytes > 0)
    {
        k[i & 3] += a[i & 3];

        uint32_t x = TailReadLE32(data, bytes);
        x ^= k[i & 3];
        TailWriteLE32(x, data, bytes);
    }
#endif // SECURITY_ENABLE_ENCRYPTION
}